

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.impl.hpp
# Opt level: O3

Mat * pobr::imgProcessing::utils::matrixOps::
      applyKernel<cv::Vec<unsigned_char,3>,std::array<double,3ul>,double>
                (Mat *img,Mat *kernel,array<double,_3UL> accumulatorInit,
                function<std::array<double,_3UL>_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
                *reducer,function<void_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
                         *applicator)

{
  int iVar1;
  long in_R8;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  cv::Mat::clone();
  iVar1 = *(int *)((long)&(reducer->super__Function_base)._M_functor + 8);
  local_5c = (iVar1 - (iVar1 + -1 >> 0x1f)) + -1 >> 1;
  iVar1 = *(int *)((long)&(reducer->super__Function_base)._M_functor + 0xc);
  local_60 = (iVar1 - (iVar1 + -1 >> 0x1f)) + -1 >> 1;
  local_54 = ~local_5c + *(int *)(kernel + 8);
  local_58 = ~local_60 + *(int *)(kernel + 0xc);
  local_48._8_8_ = 0;
  local_50 = local_60;
  local_4c = local_5c;
  local_48._M_unused._M_object = operator_new(0x60);
  *(uint **)local_48._M_unused._0_8_ = &local_50;
  *(uint **)((long)local_48._M_unused._0_8_ + 8) = &local_4c;
  *(int **)((long)local_48._M_unused._0_8_ + 0x10) = &local_58;
  *(int **)((long)local_48._M_unused._0_8_ + 0x18) = &local_54;
  *(function<std::array<double,_3UL>_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
    **)((long)local_48._M_unused._0_8_ + 0x20) = reducer;
  *(array<double,_3UL> **)((long)local_48._M_unused._0_8_ + 0x28) = &accumulatorInit;
  *(Mat **)((long)local_48._M_unused._0_8_ + 0x30) = kernel;
  *(uint **)((long)local_48._M_unused._0_8_ + 0x38) = &local_5c;
  *(uint **)((long)local_48._M_unused._0_8_ + 0x40) = &local_60;
  *(function<void_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
    **)((long)local_48._M_unused._0_8_ + 0x48) = applicator;
  *(Mat **)((long)local_48._M_unused._0_8_ + 0x50) = img;
  *(long *)((long)local_48._M_unused._0_8_ + 0x58) = in_R8;
  local_30 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/././matrix-ops.impl.hpp:49:9)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/././matrix-ops.impl.hpp:49:9)>
             ::_M_manager;
  forEachPixel(img,(function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return img;
}

Assistant:

cv::Mat
matrixOps::applyKernel(
    const cv::Mat& img,
    const cv::Mat& kernel,
    Acc accumulatorInit,
    const std::function<Acc(const uint64_t& x, const uint64_t& y, Acc& accumulator, const PixelClass& pixel, const KernelValue& kernelValue)>& reducer,
    const std::function<void(const uint64_t& x, const uint64_t& y, Acc& accumulator, PixelClass& pixel, const cv::Mat& img)>& applicator
)
{
    // Uses edge cropping
    auto resultImg = img.clone();

    const unsigned int initRow = 0 + ((kernel.rows - 1) / 2);
    const unsigned int initCol = 0 + ((kernel.cols - 1) / 2);

    const unsigned int endRow = (img.rows - 1) - initRow;
    const unsigned int endCol = (img.cols - 1) - initCol;

    const unsigned int kernelOffsetY = 0 + ((kernel.rows - 1) / 2);
    const unsigned int kernelOffsetX = 0 + ((kernel.cols - 1) / 2);

    matrixOps::forEachPixel(
        resultImg,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            if (x < initCol) {
                return;
            }
            if (y < initRow) {
                return;
            }
            if (x > endCol) {
                return;
            }
            if (y > endRow) {
                return;
            }

            Acc value = matrixOps::reduceEachPixel<Acc>(
                kernel,
                accumulatorInit,
                [&](const uint64_t& kernelX, const uint64_t& kernelY, Acc& accumulator) -> Acc
                {
                    auto& thisKernelValue = kernel.at<KernelValue>(kernelY, kernelX);
                    auto& adjacentPixel = img.at<PixelClass>(
                        y - kernelOffsetY + kernelY,
                        x - kernelOffsetX + kernelX
                    );

                    return reducer(x, y, accumulator, adjacentPixel, thisKernelValue);
                }
            );

            auto& thisPixel = resultImg.at<PixelClass>(y, x);

            applicator(x, y, value, thisPixel, img);
        }
    );

    return resultImg;
}